

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O0

Vec_Int_t * Abc_NtkFindDcLatches(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Vec_Int_t *p;
  Abc_Obj_t *pObj_00;
  int local_24;
  int i;
  Abc_Obj_t *pObj;
  Vec_Int_t *vUnknown;
  Abc_Ntk_t *pNtk_local;
  
  iVar1 = Abc_NtkLatchNum(pNtk);
  p = Vec_IntStart(iVar1);
  for (local_24 = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), local_24 < iVar1; local_24 = local_24 + 1) {
    pObj_00 = Abc_NtkBox(pNtk,local_24);
    iVar1 = Abc_ObjIsLatch(pObj_00);
    if ((iVar1 != 0) && (iVar1 = Abc_LatchIsInitDc(pObj_00), iVar1 != 0)) {
      Vec_IntWriteEntry(p,local_24,1);
      Abc_LatchSetInit0(pObj_00);
    }
  }
  return p;
}

Assistant:

Vec_Int_t * Abc_NtkFindDcLatches( Abc_Ntk_t * pNtk )
{
    Vec_Int_t * vUnknown;
    Abc_Obj_t * pObj;
    int i;
    vUnknown = Vec_IntStart( Abc_NtkLatchNum(pNtk) );
    Abc_NtkForEachLatch( pNtk, pObj, i )
        if ( Abc_LatchIsInitDc(pObj) )
        {
            Vec_IntWriteEntry( vUnknown, i, 1 );
            Abc_LatchSetInit0(pObj);
        }
    return vUnknown;
}